

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

size_t write_type(MIR_context_t ctx,writer_func_t writer,MIR_type_t t)

{
  uint uVar1;
  reduce_data *data;
  uint32_t uVar2;
  uint8_t uVar3;
  
  if (writer != (writer_func_t)0x0) {
    uVar3 = (char)t + '+';
    data = ctx->io_ctx->io_reduce_data;
    uVar1 = data->buf_bound;
    if ((ulong)uVar1 < 0x40000) {
      uVar2 = uVar1 + 1;
      data->buf[uVar1] = uVar3;
    }
    else {
      _reduce_encode_buf(data);
      uVar2 = 1;
      data->buf[0] = uVar3;
    }
    data->buf_bound = uVar2;
    return 1;
  }
  return 0;
}

Assistant:

static size_t write_type (MIR_context_t ctx, writer_func_t writer, MIR_type_t t) {
  return put_byte (ctx, writer, TAG_TI8 + (t - MIR_T_I8));
}